

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O0

int run_test_pipe_connect_multiple(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_loop_t *loop;
  int r;
  int i;
  
  loop_00 = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_pipe_init(loop_00,&server_handle,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x53,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x56,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_listen(&server_handle,0x80,connection_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x59,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  for (loop._4_4_ = 0; loop._4_4_ < 10; loop._4_4_ = loop._4_4_ + 1) {
    iVar1 = uv_pipe_init(loop_00,clients + loop._4_4_,0);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
              ,0x5d,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    uv_pipe_connect((long)loop._4_4_ * 0x150 + 0x34df18,clients + loop._4_4_,"/tmp/uv-test-sock",
                    connect_cb);
  }
  uv_run(loop_00,0);
  if ((long)connection_cb_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x66,"connection_cb_called","==","10",(long)connection_cb_called,"==",10);
    abort();
  }
  if ((long)connect_cb_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x67,"connect_cb_called","==","10",(long)connect_cb_called,"==",10);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
            ,0x69,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(pipe_connect_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb);
  ASSERT_OK(r);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT_OK(r);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(connection_cb_called, NUM_CLIENTS);
  ASSERT_EQ(connect_cb_called, NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}